

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkPartitionSmart(Abc_Ntk_t *pNtk,int nSuppSizeLimit,int fVerbose)

{
  FILE *pFile;
  int iVar1;
  int i_00;
  uint uVar2;
  abctime aVar3;
  Vec_Ptr_t *p;
  abctime aVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *vPartsAll_00;
  Vec_Ptr_t *vPartSuppsAll_00;
  ProgressBar *p_00;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  uint *puVar9;
  void *pvVar10;
  abctime clk2;
  abctime clk;
  int timeFind;
  int iOut;
  int iPart;
  int i;
  Vec_Int_t *vTemp;
  Vec_Int_t *vPartSupp;
  Vec_Int_t *vPart;
  Vec_Int_t *vOne;
  Vec_Ptr_t *vPartSuppsAll;
  Vec_Ptr_t *vPartsAll2;
  Vec_Ptr_t *vPartsAll;
  Vec_Ptr_t *vSupps;
  Vec_Ptr_t *vPartSuppsChar;
  ProgressBar *pProgress;
  int fVerbose_local;
  int nSuppSizeLimit_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar3 = Abc_Clock();
  p = Abc_NtkComputeSupportsSmart(pNtk);
  if (fVerbose != 0) {
    Abc_Print(1,"%s =","Supps");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  }
  pVVar5 = Vec_PtrAlloc(1000);
  aVar3 = Abc_Clock();
  vPartsAll_00 = Vec_PtrAlloc(0x100);
  vPartSuppsAll_00 = Vec_PtrAlloc(0x100);
  pFile = _stdout;
  iVar1 = Vec_PtrSize(p);
  p_00 = Extra_ProgressBarStart(pFile,iVar1);
  for (iOut = 0; iVar1 = Vec_PtrSize(p), iOut < iVar1; iOut = iOut + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p,iOut);
    Extra_ProgressBarUpdate(p_00,iOut,(char *)0x0);
    iVar1 = Vec_IntPop(pVVar6);
    Abc_Clock();
    i_00 = Abc_NtkPartitionSmartFindPart(vPartSuppsAll_00,vPartsAll_00,pVVar5,nSuppSizeLimit,pVVar6)
    ;
    Abc_Clock();
    if (i_00 == -1) {
      pVVar7 = Vec_IntAlloc(0x20);
      Vec_IntPush(pVVar7,iVar1);
      pVVar8 = Vec_IntDup(pVVar6);
      Vec_PtrPush(vPartsAll_00,pVVar7);
      Vec_PtrPush(vPartSuppsAll_00,pVVar8);
      iVar1 = Abc_NtkCiNum(pNtk);
      puVar9 = Abc_NtkSuppCharStart(pVVar6,iVar1);
      Vec_PtrPush(pVVar5,puVar9);
    }
    else {
      pVVar7 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll_00,i_00);
      Vec_IntPush(pVVar7,iVar1);
      pVVar7 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll_00,i_00);
      pVVar8 = Vec_IntTwoMerge(pVVar7,pVVar6);
      Vec_IntFree(pVVar7);
      Vec_PtrWriteEntry(vPartSuppsAll_00,i_00,pVVar8);
      puVar9 = (uint *)Vec_PtrEntry(pVVar5,i_00);
      iVar1 = Abc_NtkCiNum(pNtk);
      Abc_NtkSuppCharAdd(puVar9,pVVar6,iVar1);
    }
  }
  Extra_ProgressBarStop(p_00);
  for (iOut = 0; iVar1 = Vec_PtrSize(pVVar5), iOut < iVar1; iOut = iOut + 1) {
    pvVar10 = Vec_PtrEntry(pVVar5,iOut);
    if (pvVar10 != (void *)0x0) {
      free(pvVar10);
    }
  }
  Vec_PtrFree(pVVar5);
  if (fVerbose != 0) {
    Abc_Print(1,"%s =","Parts");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  }
  aVar3 = Abc_Clock();
  for (iOut = 0; iVar1 = Vec_PtrSize(vPartSuppsAll_00), iOut < iVar1; iOut = iOut + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll_00,iOut);
    Vec_IntPush(pVVar6,iOut);
  }
  Vec_VecSort((Vec_Vec_t *)vPartSuppsAll_00,1);
  pVVar5 = Vec_PtrAlloc(0x100);
  for (iOut = 0; iVar1 = Vec_PtrSize(vPartSuppsAll_00), iOut < iVar1; iOut = iOut + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll_00,iOut);
    iVar1 = Vec_IntPop(pVVar6);
    pvVar10 = Vec_PtrEntry(vPartsAll_00,iVar1);
    Vec_PtrPush(pVVar5,pvVar10);
  }
  Vec_PtrFree(vPartsAll_00);
  Abc_NtkPartitionCompact(pVVar5,vPartSuppsAll_00,nSuppSizeLimit);
  if (fVerbose != 0) {
    Abc_Print(1,"%s =","Comps");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
    uVar2 = Vec_PtrSize(pVVar5);
    printf("Created %d partitions.\n",(ulong)uVar2);
  }
  Vec_VecFree((Vec_Vec_t *)p);
  Vec_VecFree((Vec_Vec_t *)vPartSuppsAll_00);
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Abc_NtkPartitionSmart( Abc_Ntk_t * pNtk, int nSuppSizeLimit, int fVerbose )
{
    ProgressBar * pProgress;
    Vec_Ptr_t * vPartSuppsChar;
    Vec_Ptr_t * vSupps, * vPartsAll, * vPartsAll2, * vPartSuppsAll;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut, timeFind = 0;
    abctime clk, clk2;

    // compute the supports for all outputs
clk = Abc_Clock();
//    vSupps = Abc_NtkComputeSupportsNaive( pNtk );
    vSupps = Abc_NtkComputeSupportsSmart( pNtk );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}
    // start char-based support representation
    vPartSuppsChar = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(vSupps) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
//        if ( i % 1000 == 0 )
//            printf( "CIs = %6d. COs = %6d. Processed = %6d (out of %6d). Parts = %6d.\r", 
//                Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), i, Vec_PtrSize(vSupps), Vec_PtrSize(vPartsAll) ); 
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
clk2 = Abc_Clock();
        iPart = Abc_NtkPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsChar, nSuppSizeLimit, vOne );
timeFind += Abc_Clock() - clk2;
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsChar, Abc_NtkSuppCharStart(vOne, Abc_NtkCiNum(pNtk)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Abc_NtkSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsChar, iPart), vOne, Abc_NtkCiNum(pNtk) );
        }
    }
    Extra_ProgressBarStop( pProgress );

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsChar, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsChar );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
//ABC_PRT( "Find ", timeFind );
}

clk = Abc_Clock();
    // remember number of supports
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Abc_NtkPartitionPrint( pNtk, vPartsAll, vPartSuppsAll );
    Abc_NtkPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );

if ( fVerbose )
{
ABC_PRT( "Comps", Abc_Clock() - clk );
}
    if ( fVerbose )
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );
//    Abc_NtkPartitionPrint( pNtk, vPartsAll, vPartSuppsAll );

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Abc_NtkCo(pNtk, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}